

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# url.c
# Opt level: O1

CURLcode parse_proxy(SessionHandle *data,connectdata *conn,char *proxy)

{
  byte *pbVar1;
  int iVar2;
  CURLcode CVar3;
  char *pcVar4;
  size_t sVar5;
  char *pcVar6;
  ushort **ppuVar7;
  long lVar8;
  byte bVar9;
  curl_proxytype cVar10;
  byte *__s;
  bool bVar11;
  char *proxypasswd;
  char *proxyuser;
  char *local_40;
  char *local_38;
  
  pcVar4 = strstr(proxy,"://");
  if (pcVar4 != (char *)0x0) {
    iVar2 = Curl_raw_nequal("socks5h",proxy,7);
    cVar10 = CURLPROXY_SOCKS5_HOSTNAME;
    if (iVar2 == 0) {
      iVar2 = Curl_raw_nequal("socks5",proxy,6);
      cVar10 = CURLPROXY_SOCKS5;
      if (iVar2 == 0) {
        iVar2 = Curl_raw_nequal("socks4a",proxy,7);
        cVar10 = CURLPROXY_SOCKS4A;
        if (iVar2 == 0) {
          iVar2 = Curl_raw_nequal("socks4",proxy,6);
          cVar10 = CURLPROXY_SOCKS4;
          if ((iVar2 == 0) &&
             (iVar2 = Curl_raw_nequal("socks",proxy,5), proxy = pcVar4 + 3, iVar2 == 0))
          goto LAB_00493bc8;
        }
      }
    }
    conn->proxytype = cVar10;
    proxy = pcVar4 + 3;
  }
LAB_00493bc8:
  pcVar4 = strchr(proxy,0x40);
  if (pcVar4 != (char *)0x0) {
    local_38 = (char *)0x0;
    local_40 = (char *)0x0;
    CVar3 = parse_login_details(proxy,(long)pcVar4 - (long)proxy,&local_38,&local_40,(char **)0x0);
    if (CVar3 == CURLE_OK) {
      (*Curl_cfree)(conn->proxyuser);
      pcVar6 = local_38;
      conn->proxyuser = (char *)0x0;
      if ((local_38 == (char *)0x0) || (sVar5 = strlen(local_38), 0xff < sVar5)) {
        pcVar6 = (*Curl_cstrdup)("");
      }
      else {
        pcVar6 = curl_easy_unescape(data,pcVar6,0,(int *)0x0);
      }
      conn->proxyuser = pcVar6;
      if (pcVar6 == (char *)0x0) {
        bVar11 = false;
        CVar3 = CURLE_OUT_OF_MEMORY;
      }
      else {
        (*Curl_cfree)(conn->proxypasswd);
        pcVar6 = local_40;
        conn->proxypasswd = (char *)0x0;
        if ((local_40 == (char *)0x0) || (sVar5 = strlen(local_40), 0xff < sVar5)) {
          pcVar6 = (*Curl_cstrdup)("");
        }
        else {
          pcVar6 = curl_easy_unescape(data,pcVar6,0,(int *)0x0);
        }
        conn->proxypasswd = pcVar6;
        bVar11 = pcVar6 != (char *)0x0;
        CVar3 = CURLE_OUT_OF_MEMORY;
        if (bVar11) {
          CVar3 = CURLE_OK;
        }
      }
      if (bVar11) {
        (conn->bits).proxy_user_passwd = true;
        proxy = pcVar4 + 1;
        CVar3 = CURLE_OK;
      }
    }
    (*Curl_cfree)(local_38);
    (*Curl_cfree)(local_40);
    if (CVar3 != CURLE_OK) {
      return CVar3;
    }
  }
  __s = (byte *)proxy;
  if (*proxy == 0x5b) {
    pbVar1 = (byte *)proxy + 1;
    bVar9 = ((byte *)proxy)[1];
    __s = pbVar1;
    if (bVar9 != 0) {
      ppuVar7 = __ctype_b_loc();
      __s = (byte *)proxy + 2;
      do {
        if (((((*ppuVar7)[bVar9] >> 0xc & 1) == 0) && (bVar9 != 0x2e)) && (bVar9 != 0x3a)) {
          if (bVar9 == 0x25) {
            iVar2 = strncmp("%25",(char *)(__s + -1),3);
            if (iVar2 != 0) {
              Curl_infof(data,"Please URL encode %% as %%25, see RFC 6874.\n");
            }
            bVar9 = *__s;
            if (bVar9 == 0) goto LAB_00493de4;
            ppuVar7 = __ctype_b_loc();
            goto LAB_00493db1;
          }
          break;
        }
        bVar9 = *__s;
        __s = __s + 1;
      } while (bVar9 != 0);
      __s = __s + -1;
    }
    goto LAB_00493de4;
  }
  goto LAB_00493e06;
  while( true ) {
    bVar9 = __s[1];
    __s = __s + 1;
    if (bVar9 == 0) break;
LAB_00493db1:
    if (((((*ppuVar7)[bVar9] & 0x1400) == 0) && (1 < bVar9 - 0x2d)) &&
       ((bVar9 != 0x5f && (bVar9 != 0x7e)))) break;
  }
LAB_00493de4:
  proxy = (char *)pbVar1;
  if (*__s == 0x5d) {
    *__s = 0;
    __s = __s + 1;
  }
  else {
    Curl_infof(data,"Invalid IPv6 address format\n");
  }
LAB_00493e06:
  pcVar4 = strchr((char *)__s,0x3a);
  if (pcVar4 == (char *)0x0) {
    if (*proxy == 0x2f) {
      return CURLE_COULDNT_RESOLVE_PROXY;
    }
    pcVar4 = strchr(proxy,0x2f);
    if (pcVar4 != (char *)0x0) {
      *pcVar4 = '\0';
    }
    lVar8 = (data->set).proxyport;
    if (lVar8 == 0) goto LAB_00493e34;
  }
  else {
    *pcVar4 = '\0';
    lVar8 = strtol(pcVar4 + 1,(char **)0x0,10);
  }
  conn->port = lVar8;
LAB_00493e34:
  pcVar4 = (*Curl_cstrdup)(proxy);
  (conn->proxy).rawalloc = pcVar4;
  (conn->proxy).name = pcVar4;
  CVar3 = CURLE_OUT_OF_MEMORY;
  if (pcVar4 != (char *)0x0) {
    CVar3 = CURLE_OK;
  }
  return CVar3;
}

Assistant:

static CURLcode parse_proxy(struct SessionHandle *data,
                            struct connectdata *conn, char *proxy)
{
  char *prox_portno;
  char *endofprot;

  /* We use 'proxyptr' to point to the proxy name from now on... */
  char *proxyptr;
  char *portptr;
  char *atsign;

  /* We do the proxy host string parsing here. We want the host name and the
   * port name. Accept a protocol:// prefix
   */

  /* Parse the protocol part if present */
  endofprot = strstr(proxy, "://");
  if(endofprot) {
    proxyptr = endofprot+3;
    if(checkprefix("socks5h", proxy))
      conn->proxytype = CURLPROXY_SOCKS5_HOSTNAME;
    else if(checkprefix("socks5", proxy))
      conn->proxytype = CURLPROXY_SOCKS5;
    else if(checkprefix("socks4a", proxy))
      conn->proxytype = CURLPROXY_SOCKS4A;
    else if(checkprefix("socks4", proxy) || checkprefix("socks", proxy))
      conn->proxytype = CURLPROXY_SOCKS4;
    /* Any other xxx:// : change to http proxy */
  }
  else
    proxyptr = proxy; /* No xxx:// head: It's a HTTP proxy */

  /* Is there a username and password given in this proxy url? */
  atsign = strchr(proxyptr, '@');
  if(atsign) {
    char *proxyuser = NULL;
    char *proxypasswd = NULL;
    CURLcode result =
      parse_login_details(proxyptr, atsign - proxyptr,
                          &proxyuser, &proxypasswd, NULL);
    if(!result) {
      /* found user and password, rip them out.  note that we are
         unescaping them, as there is otherwise no way to have a
         username or password with reserved characters like ':' in
         them. */
      Curl_safefree(conn->proxyuser);
      if(proxyuser && strlen(proxyuser) < MAX_CURL_USER_LENGTH)
        conn->proxyuser = curl_easy_unescape(data, proxyuser, 0, NULL);
      else
        conn->proxyuser = strdup("");

      if(!conn->proxyuser)
        result = CURLE_OUT_OF_MEMORY;
      else {
        Curl_safefree(conn->proxypasswd);
        if(proxypasswd && strlen(proxypasswd) < MAX_CURL_PASSWORD_LENGTH)
          conn->proxypasswd = curl_easy_unescape(data, proxypasswd, 0, NULL);
        else
          conn->proxypasswd = strdup("");

        if(!conn->proxypasswd)
          result = CURLE_OUT_OF_MEMORY;
      }

      if(!result) {
        conn->bits.proxy_user_passwd = TRUE; /* enable it */
        atsign++; /* the right side of the @-letter */

        proxyptr = atsign; /* now use this instead */
      }
    }

    free(proxyuser);
    free(proxypasswd);

    if(result)
      return result;
  }

  /* start scanning for port number at this point */
  portptr = proxyptr;

  /* detect and extract RFC6874-style IPv6-addresses */
  if(*proxyptr == '[') {
    char *ptr = ++proxyptr; /* advance beyond the initial bracket */
    while(*ptr && (ISXDIGIT(*ptr) || (*ptr == ':') || (*ptr == '.')))
      ptr++;
    if(*ptr == '%') {
      /* There might be a zone identifier */
      if(strncmp("%25", ptr, 3))
        infof(data, "Please URL encode %% as %%25, see RFC 6874.\n");
      ptr++;
      /* Allow unresered characters as defined in RFC 3986 */
      while(*ptr && (ISALPHA(*ptr) || ISXDIGIT(*ptr) || (*ptr == '-') ||
                     (*ptr == '.') || (*ptr == '_') || (*ptr == '~')))
        ptr++;
    }
    if(*ptr == ']')
      /* yeps, it ended nicely with a bracket as well */
      *ptr++ = 0;
    else
      infof(data, "Invalid IPv6 address format\n");
    portptr = ptr;
    /* Note that if this didn't end with a bracket, we still advanced the
     * proxyptr first, but I can't see anything wrong with that as no host
     * name nor a numeric can legally start with a bracket.
     */
  }

  /* Get port number off proxy.server.com:1080 */
  prox_portno = strchr(portptr, ':');
  if(prox_portno) {
    *prox_portno = 0x0; /* cut off number from host name */
    prox_portno ++;
    /* now set the local port number */
    conn->port = strtol(prox_portno, NULL, 10);
  }
  else {
    if(proxyptr[0]=='/')
      /* If the first character in the proxy string is a slash, fail
         immediately. The following code will otherwise clear the string which
         will lead to code running as if no proxy was set! */
      return CURLE_COULDNT_RESOLVE_PROXY;

    /* without a port number after the host name, some people seem to use
       a slash so we strip everything from the first slash */
    atsign = strchr(proxyptr, '/');
    if(atsign)
      *atsign = 0x0; /* cut off path part from host name */

    if(data->set.proxyport)
      /* None given in the proxy string, then get the default one if it is
         given */
      conn->port = data->set.proxyport;
  }

  /* now, clone the cleaned proxy host name */
  conn->proxy.rawalloc = strdup(proxyptr);
  conn->proxy.name = conn->proxy.rawalloc;

  if(!conn->proxy.rawalloc)
    return CURLE_OUT_OF_MEMORY;

  return CURLE_OK;
}